

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

String * __thiscall
doctest::detail::stringifyBinaryExpr<char[7],std::__cxx11::string>
          (String *__return_storage_ptr__,detail *this,char (*lhs) [7],char *op,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rhs)

{
  size_t sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in;
  anon_union_24_2_13149d16_for_String_2 local_78;
  anon_union_24_2_13149d16_for_String_2 local_60;
  anon_union_24_2_13149d16_for_String_2 local_48;
  anon_union_24_2_13149d16_for_String_2 local_30;
  
  StringMakerBase<true>::convert<char[7]>((String *)&local_48.data,(char (*) [7])this);
  sVar1 = strlen(*lhs);
  String::String((String *)&local_60.data,*lhs,(uint)sVar1);
  String::operator+((String *)&local_30.data,(String *)&local_48.data,(String *)&local_60.data);
  StringMakerBase<true>::convert<std::__cxx11::string>
            ((String *)&local_78.data,(StringMakerBase<true> *)op,in);
  String::operator+(__return_storage_ptr__,(String *)&local_30.data,(String *)&local_78.data);
  if ((local_78.buf[0x17] < '\0') && (local_78.data.ptr != (char *)0x0)) {
    operator_delete__(local_78.data.ptr);
  }
  if ((local_30.buf[0x17] < '\0') && (local_30.data.ptr != (char *)0x0)) {
    operator_delete__(local_30.data.ptr);
  }
  if ((local_60.buf[0x17] < '\0') && (local_60.data.ptr != (char *)0x0)) {
    operator_delete__(local_60.data.ptr);
  }
  if ((local_48.buf[0x17] < '\0') && (local_48.data.ptr != (char *)0x0)) {
    operator_delete__(local_48.data.ptr);
  }
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        // NOLINTNEXTLINE(clang-analyzer-cplusplus.NewDeleteLeaks)
        return toString(lhs) + op + toString(rhs);
    }